

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O1

uint32_t duckdb_enum_dictionary_size(duckdb_logical_type type)

{
  uint uVar1;
  idx_t val;
  
  if ((type != (duckdb_logical_type)0x0) && (*type == (_duckdb_logical_type)0x68)) {
    val = duckdb::EnumType::GetSize((LogicalType *)type);
    uVar1 = duckdb::NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(val);
    return uVar1;
  }
  return 0;
}

Assistant:

static bool AssertLogicalTypeId(duckdb_logical_type type, duckdb::LogicalTypeId type_id) {
	if (!type) {
		return false;
	}
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	if (logical_type.id() != type_id) {
		return false;
	}
	return true;
}